

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::java::ImmutableMessageGenerator::GenerateMessageSerializationMethods
          (ImmutableMessageGenerator *this,Printer *printer)

{
  ZeroCopyOutputStream *pZVar1;
  iterator iVar2;
  _Alloc_hider this_00;
  bool bVar3;
  ulong uVar4;
  FieldDescriptor **ppFVar5;
  ImmutableFieldGenerator *pIVar6;
  Descriptor *pDVar7;
  int iVar8;
  long lVar9;
  char *pcVar10;
  Printer *this_01;
  long lVar11;
  scoped_array<const_google::protobuf::FieldDescriptor_*> sorted_fields;
  vector<const_google::protobuf::Descriptor::ExtensionRange_*,_std::allocator<const_google::protobuf::Descriptor::ExtensionRange_*>_>
  sorted_extensions;
  scoped_array<const_google::protobuf::FieldDescriptor_*> local_a0;
  ZeroCopyOutputStream *local_98;
  iterator iStack_90;
  ExtensionRange **local_88;
  _Alloc_hider local_78;
  undefined1 local_70 [32];
  string local_50;
  
  local_a0.array_ = SortFieldsByNumber((this->super_MessageGenerator).descriptor_);
  local_98 = (ZeroCopyOutputStream *)0x0;
  iStack_90._M_current = (ExtensionRange **)0x0;
  local_88 = (ExtensionRange **)0x0;
  pDVar7 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar7 + 0x68)) {
    lVar11 = 0;
    lVar9 = 0;
    do {
      local_70._0_8_ = *(long *)(pDVar7 + 0x70) + lVar11;
      if (iStack_90._M_current == local_88) {
        std::
        vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
        ::_M_realloc_insert<google::protobuf::Descriptor::ExtensionRange_const*>
                  ((vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>
                    *)&local_98,iStack_90,(ExtensionRange **)local_70);
      }
      else {
        *iStack_90._M_current = (ExtensionRange *)local_70._0_8_;
        iStack_90._M_current = iStack_90._M_current + 1;
      }
      iVar2._M_current = iStack_90._M_current;
      pZVar1 = local_98;
      lVar9 = lVar9 + 1;
      pDVar7 = (this->super_MessageGenerator).descriptor_;
      lVar11 = lVar11 + 8;
    } while (lVar9 < *(int *)(pDVar7 + 0x68));
    if (local_98 != (ZeroCopyOutputStream *)iStack_90._M_current) {
      uVar4 = (long)iStack_90._M_current - (long)local_98 >> 3;
      lVar9 = 0x3f;
      if (uVar4 != 0) {
        for (; uVar4 >> lVar9 == 0; lVar9 = lVar9 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::java::ExtensionRangeOrdering>>
                (local_98,iStack_90._M_current,((uint)lVar9 ^ 0x3f) * 2 ^ 0x7e);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<google::protobuf::Descriptor::ExtensionRange_const**,std::vector<google::protobuf::Descriptor::ExtensionRange_const*,std::allocator<google::protobuf::Descriptor::ExtensionRange_const*>>>,__gnu_cxx::__ops::_Iter_comp_iter<google::protobuf::compiler::java::ExtensionRangeOrdering>>
                (pZVar1,iVar2._M_current);
    }
  }
  io::Printer::Print(printer,
                     "public void writeTo(com.google.protobuf.CodedOutputStream output)\n                    throws java.io.IOException {\n"
                    );
  this_01 = printer;
  io::Printer::Indent(printer);
  pDVar7 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar7 + 0x2c)) {
    lVar9 = 0;
    lVar11 = 0;
    do {
      this_01 = (Printer *)(*(long *)(pDVar7 + 0x30) + lVar9);
      bVar3 = FieldDescriptor::is_packed((FieldDescriptor *)this_01);
      if (bVar3) {
        this_01 = printer;
        io::Printer::Print(printer,"getSerializedSize();\n");
        break;
      }
      lVar11 = lVar11 + 1;
      lVar9 = lVar9 + 0xa8;
    } while (lVar11 < *(int *)(pDVar7 + 0x2c));
  }
  pDVar7 = (this->super_MessageGenerator).descriptor_;
  if (0 < *(int *)(pDVar7 + 0x68)) {
    if (*(char *)(*(long *)(pDVar7 + 0x20) + 0x68) == '\x01') {
      ClassNameResolver::GetClassName_abi_cxx11_
                ((string *)local_70,this->name_resolver_,pDVar7,true);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50.field_2._M_allocated_capacity._0_2_ = 0x3356;
      local_50._M_string_length = 2;
      local_50.field_2._M_local_buf[2] = '\0';
      io::Printer::Print(printer,
                         "com.google.protobuf.GeneratedMessage$ver$\n  .ExtendableMessage<$classname$>.ExtensionWriter\n    extensionWriter = newMessageSetExtensionWriter();\n"
                         ,"classname",(string *)local_70,"ver",&local_50);
    }
    else {
      ClassNameResolver::GetClassName_abi_cxx11_
                ((string *)local_70,this->name_resolver_,pDVar7,true);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      local_50.field_2._M_allocated_capacity._0_2_ = 0x3356;
      local_50._M_string_length = 2;
      local_50.field_2._M_local_buf[2] = '\0';
      io::Printer::Print(printer,
                         "com.google.protobuf.GeneratedMessage$ver$\n  .ExtendableMessage<$classname$>.ExtensionWriter\n    extensionWriter = newExtensionWriter();\n"
                         ,"classname",(string *)local_70,"ver",&local_50);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,
                      CONCAT53(local_50.field_2._M_allocated_capacity._3_5_,
                               CONCAT12(local_50.field_2._M_local_buf[2],
                                        local_50.field_2._M_allocated_capacity._0_2_)) + 1);
    }
    this_01 = (Printer *)local_70._0_8_;
    if ((Printer *)local_70._0_8_ != (Printer *)(local_70 + 0x10)) {
      operator_delete((void *)local_70._0_8_,local_70._16_8_ + 1);
    }
  }
  local_78._M_p = (pointer)&this->field_generators_;
  iVar8 = 0;
  uVar4 = 0;
LAB_00270444:
  uVar4 = (ulong)(int)uVar4;
  do {
    pDVar7 = (this->super_MessageGenerator).descriptor_;
    if ((*(int *)(pDVar7 + 0x2c) <= iVar8) &&
       ((ulong)((long)iStack_90._M_current - (long)local_98 >> 3) <= uVar4)) {
      if (*(int *)(*(long *)(pDVar7 + 0x10) + 0x8c) != 3) {
        pcVar10 = "unknownFields.writeTo(output);\n";
        if (*(char *)(*(long *)(pDVar7 + 0x20) + 0x68) != '\0') {
          pcVar10 = "unknownFields.writeAsMessageSetTo(output);\n";
        }
        io::Printer::Print(printer,pcVar10);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,
                         "}\n\npublic int getSerializedSize() {\n  int size = memoizedSize;\n  if (size != -1) return size;\n\n  size = 0;\n"
                        );
      io::Printer::Indent(printer);
      this_00._M_p = local_78._M_p;
      pDVar7 = (this->super_MessageGenerator).descriptor_;
      if (0 < *(int *)(pDVar7 + 0x2c)) {
        lVar9 = 0;
        do {
          ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                              (&local_a0,lVar9);
          pIVar6 = FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                             ((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
                               *)this_00._M_p,*ppFVar5);
          (*pIVar6->_vptr_ImmutableFieldGenerator[0xf])(pIVar6,printer);
          lVar9 = lVar9 + 1;
          pDVar7 = (this->super_MessageGenerator).descriptor_;
        } while (lVar9 < *(int *)(pDVar7 + 0x2c));
      }
      if (0 < *(int *)(pDVar7 + 0x68)) {
        pcVar10 = "size += extensionsSerializedSize();\n";
        if (*(char *)(*(long *)(pDVar7 + 0x20) + 0x68) != '\0') {
          pcVar10 = "size += extensionsSerializedSizeAsMessageSet();\n";
        }
        io::Printer::Print(printer,pcVar10);
      }
      pDVar7 = (this->super_MessageGenerator).descriptor_;
      if (*(int *)(*(long *)(pDVar7 + 0x10) + 0x8c) != 3) {
        pcVar10 = "size += unknownFields.getSerializedSize();\n";
        if (*(char *)(*(long *)(pDVar7 + 0x20) + 0x68) != '\0') {
          pcVar10 = "size += unknownFields.getSerializedSizeAsMessageSet();\n";
        }
        io::Printer::Print(printer,pcVar10);
      }
      io::Printer::Outdent(printer);
      io::Printer::Print(printer,"  memoizedSize = size;\n  return size;\n}\n\n");
      io::Printer::Print(printer,"private static final long serialVersionUID = 0L;\n");
      if (local_98 != (ZeroCopyOutputStream *)0x0) {
        operator_delete(local_98,(long)local_88 - (long)local_98);
      }
      if (local_a0.array_ != (FieldDescriptor **)0x0) {
        operator_delete__(local_a0.array_);
      }
      return;
    }
    if (iVar8 == *(int *)(pDVar7 + 0x2c)) {
      GenerateSerializeOneExtensionRange
                ((ImmutableMessageGenerator *)this_01,printer,
                 (ExtensionRange *)local_98[uVar4]._vptr_ZeroCopyOutputStream);
    }
    else {
      lVar9 = (long)iStack_90._M_current - (long)local_98;
      this_01 = (Printer *)&local_a0;
      ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                          ((scoped_array<const_google::protobuf::FieldDescriptor_*> *)this_01,
                           (long)iVar8);
      if (uVar4 == lVar9 >> 3) {
        this_01 = (Printer *)
                  FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                            ((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
                              *)local_78._M_p,*ppFVar5);
        (*(*(_func_int ***)this_01)[0xe])(this_01,printer);
        goto LAB_002704ff;
      }
      if (*(int *)(*ppFVar5 + 0x38) <
          ((ExtensionRange *)local_98[uVar4]._vptr_ZeroCopyOutputStream)->start) break;
      GenerateSerializeOneExtensionRange
                ((ImmutableMessageGenerator *)this_01,printer,
                 (ExtensionRange *)local_98[uVar4]._vptr_ZeroCopyOutputStream);
    }
    uVar4 = uVar4 + 1;
  } while( true );
  ppFVar5 = internal::scoped_array<const_google::protobuf::FieldDescriptor_*>::operator[]
                      (&local_a0,(long)iVar8);
  this_01 = (Printer *)
            FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>::get
                      ((FieldGeneratorMap<google::protobuf::compiler::java::ImmutableFieldGenerator>
                        *)local_78._M_p,*ppFVar5);
  (*(*(_func_int ***)this_01)[0xe])(this_01,printer);
LAB_002704ff:
  iVar8 = iVar8 + 1;
  goto LAB_00270444;
}

Assistant:

void ImmutableMessageGenerator::
GenerateMessageSerializationMethods(io::Printer* printer) {
  google::protobuf::scoped_array<const FieldDescriptor * > sorted_fields(
      SortFieldsByNumber(descriptor_));

  std::vector<const Descriptor::ExtensionRange*> sorted_extensions;
  for (int i = 0; i < descriptor_->extension_range_count(); ++i) {
    sorted_extensions.push_back(descriptor_->extension_range(i));
  }
  std::sort(sorted_extensions.begin(), sorted_extensions.end(),
            ExtensionRangeOrdering());
  printer->Print(
    "public void writeTo(com.google.protobuf.CodedOutputStream output)\n"
    "                    throws java.io.IOException {\n");
  printer->Indent();
  if (HasPackedFields(descriptor_)) {
    // writeTo(CodedOutputStream output) might be invoked without
    // getSerializedSize() ever being called, but we need the memoized
    // sizes in case this message has packed fields. Rather than emit checks for
    // each packed field, just call getSerializedSize() up front.
    // In most cases, getSerializedSize() will have already been called anyway
    // by one of the wrapper writeTo() methods, making this call cheap.
    printer->Print(
      "getSerializedSize();\n");
  }

  if (descriptor_->extension_range_count() > 0) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "com.google.protobuf.GeneratedMessage$ver$\n"
        "  .ExtendableMessage<$classname$>.ExtensionWriter\n"
        "    extensionWriter = newMessageSetExtensionWriter();\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "ver", GeneratedCodeVersionSuffix());
    } else {
      printer->Print(
        "com.google.protobuf.GeneratedMessage$ver$\n"
        "  .ExtendableMessage<$classname$>.ExtensionWriter\n"
        "    extensionWriter = newExtensionWriter();\n",
        "classname", name_resolver_->GetImmutableClassName(descriptor_),
        "ver", GeneratedCodeVersionSuffix());
    }
  }

  // Merge the fields and the extension ranges, both sorted by field number.
  for (int i = 0, j = 0;
       i < descriptor_->field_count() || j < sorted_extensions.size();
       ) {
    if (i == descriptor_->field_count()) {
      GenerateSerializeOneExtensionRange(printer, sorted_extensions[j++]);
    } else if (j == sorted_extensions.size()) {
      GenerateSerializeOneField(printer, sorted_fields[i++]);
    } else if (sorted_fields[i]->number() < sorted_extensions[j]->start) {
      GenerateSerializeOneField(printer, sorted_fields[i++]);
    } else {
      GenerateSerializeOneExtensionRange(printer, sorted_extensions[j++]);
    }
  }

  if (PreserveUnknownFields(descriptor_)) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "unknownFields.writeAsMessageSetTo(output);\n");
    } else {
      printer->Print(
        "unknownFields.writeTo(output);\n");
    }
  }

  printer->Outdent();
  printer->Print(
    "}\n"
    "\n"
    "public int getSerializedSize() {\n"
    "  int size = memoizedSize;\n"
    "  if (size != -1) return size;\n"
    "\n"
    "  size = 0;\n");
  printer->Indent();

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(sorted_fields[i]).GenerateSerializedSizeCode(printer);
  }

  if (descriptor_->extension_range_count() > 0) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "size += extensionsSerializedSizeAsMessageSet();\n");
    } else {
      printer->Print(
        "size += extensionsSerializedSize();\n");
    }
  }

  if (PreserveUnknownFields(descriptor_)) {
    if (descriptor_->options().message_set_wire_format()) {
      printer->Print(
        "size += unknownFields.getSerializedSizeAsMessageSet();\n");
    } else {
      printer->Print(
        "size += unknownFields.getSerializedSize();\n");
    }
  }

  printer->Outdent();
  printer->Print(
    "  memoizedSize = size;\n"
    "  return size;\n"
    "}\n"
    "\n");

  printer->Print(
    "private static final long serialVersionUID = 0L;\n");
}